

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::iterate(TextureGatherCase *this)

{
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *pMVar1;
  ostringstream *poVar2;
  GatherType GVar3;
  TextureType TVar4;
  ChannelOrder CVar5;
  GatherType GVar6;
  ChannelType CVar7;
  ShaderProgram *pSVar8;
  undefined8 uVar9;
  int iVar10;
  DataType DVar11;
  uint uVar12;
  TextureFormat *pTVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar14;
  undefined8 *puVar15;
  pointer pcVar16;
  TestError *pTVar17;
  int i;
  ChannelType CVar18;
  TextureFormat TVar19;
  Platform *pPVar20;
  long *plVar21;
  ulong *puVar22;
  size_type *psVar23;
  TextureFormat TVar24;
  int j;
  long lVar25;
  IterateResult IVar26;
  ulong uVar27;
  undefined1 *__s;
  char *pcVar28;
  int iVar29;
  long lVar30;
  bool bVar31;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> attrBindings;
  string texCoordType;
  string texCoordType_1;
  float normalizedCoord [8];
  ScopedLogSection iterationSection;
  Vec2 texCoordVec [4];
  string refZExpr;
  string vertexSource;
  char *__end;
  string funcCall;
  float position [8];
  uint in_stack_fffffffffffff92c;
  undefined2 in_stack_fffffffffffff930;
  char cVar32;
  string local_6c8;
  undefined1 local_6a0 [16];
  Platform local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_688;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *local_678;
  undefined1 local_670 [40];
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_648;
  allocator<char> local_639;
  long *local_638;
  long local_630;
  long local_628;
  long lStack_620;
  ulong *local_618;
  long local_610;
  ulong local_608;
  long lStack_600;
  undefined1 local_5f8 [8];
  undefined1 auStack_5f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5e0;
  long *local_5c8;
  long local_5c0;
  long local_5b8;
  long lStack_5b0;
  long *local_5a8;
  long local_5a0;
  long local_598;
  long lStack_590;
  long *local_588;
  long local_580;
  long local_578;
  long lStack_570;
  long *local_568;
  long local_560;
  long local_558;
  long lStack_550;
  long *local_548;
  long local_540;
  long local_538;
  long lStack_530;
  long *local_528;
  long local_520;
  long local_518;
  long lStack_510;
  TextureFormat *local_508;
  RenderContext *local_500;
  long *local_4f8;
  long local_4f0;
  long local_4e8;
  long lStack_4e0;
  long local_4d8;
  long *local_4d0;
  long local_4c8;
  long local_4c0;
  long lStack_4b8;
  TextureFormat local_4b0;
  ShaderProgram *local_4a8;
  ScopedLogSection local_4a0;
  undefined1 local_498 [8];
  TextureFormat TStack_490;
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  undefined8 uStack_470;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_408;
  FilterMode local_3f0;
  undefined1 local_3e8 [24];
  undefined1 local_3d0;
  long *local_3c8;
  long local_3c0;
  long local_3b8;
  long lStack_3b0;
  undefined1 local_3a8 [32];
  ulong *local_388;
  long local_380;
  ulong local_378 [2];
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  undefined1 local_348 [16];
  TestContext *local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_330;
  int local_320;
  VertexArrayPointer local_318 [2];
  ios_base local_2d8 [8];
  ios_base local_2d0 [264];
  char *local_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  undefined1 local_180 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158 [16];
  qpWatchDog *local_148 [2];
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_138;
  undefined1 local_128 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_98;
  FilterMode local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  bool local_60;
  TextureFormat local_54 [4];
  
  TVar24 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  std::ostream::operator<<((ostringstream *)local_348,this->m_currentIteration);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  pTVar13 = (TextureFormat *)std::__cxx11::string::replace((ulong)local_128,0,(char *)0x0,0x9725fb);
  TVar19 = (TextureFormat)(pTVar13 + 2);
  if (*pTVar13 == TVar19) {
    local_488._0_8_ = *(undefined8 *)TVar19;
    local_488._8_8_ = pTVar13[3];
    local_498 = (undefined1  [8])local_488;
  }
  else {
    local_488._0_8_ = *(undefined8 *)TVar19;
    local_498 = (undefined1  [8])*pTVar13;
  }
  TStack_490 = pTVar13[1];
  *pTVar13 = TVar19;
  pTVar13[1].order = R;
  pTVar13[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar13[2].order = R;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  std::ostream::operator<<(local_348,this->m_currentIteration);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  pTVar13 = (TextureFormat *)std::__cxx11::string::replace((ulong)local_6a0,0,(char *)0x0,0x96cfde);
  TVar19 = (TextureFormat)(pTVar13 + 2);
  if (*pTVar13 == TVar19) {
    auStack_5f0._8_8_ = *(undefined8 *)TVar19;
    aStack_5e0._M_allocated_capacity = (size_type)pTVar13[3];
    local_5f8 = (undefined1  [8])((long)auStack_5f0 + 8);
  }
  else {
    auStack_5f0._8_8_ = *(undefined8 *)TVar19;
    local_5f8 = (undefined1  [8])*pTVar13;
  }
  auStack_5f0._0_8_ = pTVar13[1];
  *pTVar13 = TVar19;
  pTVar13[1].order = R;
  pTVar13[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar13[2].order = R;
  tcu::ScopedLogSection::ScopedLogSection
            (&local_4a0,(TestLog *)TVar24,(string *)local_498,(string *)local_5f8);
  if (local_5f8 != (undefined1  [8])((long)auStack_5f0 + 8)) {
    operator_delete((void *)local_5f8,auStack_5f0._8_8_ + 1);
  }
  if ((Platform *)local_6a0._0_8_ != &local_690) {
    operator_delete((void *)local_6a0._0_8_,(long)local_690._vptr_Platform + 1);
  }
  if (local_498 != (undefined1  [8])local_488) {
    operator_delete((void *)local_498,local_488._0_8_ + 1);
  }
  if (local_128._0_8_ != (long)local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  local_500 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar10 = (*local_500->_vptr_RenderContext[3])();
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (local_54,this,(ulong)(uint)this->m_currentIteration);
  local_3a8._0_8_ = local_3a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"v_normalizedCoord.x","");
  GVar3 = this->m_gatherType;
  bVar31 = true;
  if (GVar3 != GATHERTYPE_OFFSET_DYNAMIC) {
    bVar31 = ((this->m_textureFormat).order - D & 0xfffffffd) == 0;
  }
  uVar12 = (uint)CONCAT12(bVar31,in_stack_fffffffffffff930);
  local_4a8 = (ShaderProgram *)operator_new(0xd0);
  TVar4 = this->m_textureType;
  uVar27 = (ulong)TVar4;
  getOffsetRange((TextureGatherCase *)local_180);
  local_508 = &this->m_textureFormat;
  CVar5 = local_508->order;
  local_648 = (MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
              CONCAT71(local_648._1_7_,true);
  if (GVar3 != GATHERTYPE_OFFSET_DYNAMIC) {
    local_648 = (MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
                CONCAT71(local_648._1_7_,(CVar5 - D & 0xfffffffd) == 0);
  }
  iVar29 = CONCAT13(CVar5 == DS,(int3)uVar12);
  if ((CVar5 == DS) || (CVar5 == D)) {
    if (TVar4 < TEXTURETYPE_3D) {
      local_670._32_8_ = ZEXT48(*(uint *)(&DAT_009a3c9c + uVar27 * 4));
      local_678 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *
                  )CONCAT44(local_678._4_4_,*(undefined4 *)(&DAT_009a3ca8 + uVar27 * 4));
    }
    else {
LAB_005f056e:
      local_678 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *
                  )CONCAT44(local_678._4_4_,0xffffffff);
      local_670._32_8_ = 0x5e;
    }
  }
  else {
    if (uVar27 == 2) {
      DVar11 = glu::getSampler2DArrayType(*local_508);
      local_670._32_8_ = CONCAT44(extraout_var_02,DVar11);
    }
    else {
      if (TVar4 != TEXTURETYPE_CUBE) {
        if (TVar4 != TEXTURETYPE_2D) goto LAB_005f056e;
        DVar11 = glu::getSampler2DType(*local_508);
        local_670._32_8_ = CONCAT44(extraout_var_00,DVar11);
        local_678 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                     *)CONCAT44(local_678._4_4_,2);
        goto LAB_005f05b7;
      }
      DVar11 = glu::getSamplerCubeType(*local_508);
      local_670._32_8_ = CONCAT44(extraout_var_01,DVar11);
    }
    local_678 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                CONCAT44(local_678._4_4_,3);
  }
LAB_005f05b7:
  genGatherFuncCall((string *)(local_180 + 8),(TextureGatherCase *)(ulong)GVar3,
                    (GatherType)local_508,local_54,(GatherArgs *)local_3a8,(string *)local_180,
                    (IVec2 *)CONCAT44(in_stack_fffffffffffff92c,1),iVar29);
  __s = local_498;
  local_4b0 = TVar24;
  memset(__s,0,0xac);
  local_3e8._0_8_ = (pointer)0x0;
  local_3e8[8] = 0;
  local_3e8._9_7_ = 0;
  local_3e8[0x10] = 0;
  stack0xfffffffffffffc29 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  std::ostream::operator<<(local_348,(int)local_678);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_670,0,(char *)0x0,0x9802a7);
  pPVar20 = (Platform *)(plVar14 + 2);
  if ((Platform *)*plVar14 == pPVar20) {
    local_690._vptr_Platform = pPVar20->_vptr_Platform;
    aStack_688._M_allocated_capacity = plVar14[3];
    local_6a0._0_8_ = &local_690;
  }
  else {
    local_690._vptr_Platform = pPVar20->_vptr_Platform;
    local_6a0._0_8_ = (Platform *)*plVar14;
  }
  local_6a0._8_8_ = plVar14[1];
  *plVar14 = (long)pPVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  local_4d8 = CONCAT44(extraout_var,iVar10);
  if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
    operator_delete((void *)local_670._0_8_,local_670._16_8_ + 1);
  }
  pcVar28 = "${GPU_SHADER5_REQUIRE}\n";
  if ((GVar3 & ~GATHERTYPE_OFFSET) != GATHERTYPE_OFFSET_DYNAMIC) {
    pcVar28 = "";
  }
  local_4f8 = &local_4e8;
  local_1c8 = pcVar28 + 0x17;
  if ((GVar3 & ~GATHERTYPE_OFFSET) != GATHERTYPE_OFFSET_DYNAMIC) {
    local_1c8 = pcVar28;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_4f8,0,(char *)0x0,0x9495b8);
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_4c0 = *plVar21;
    lStack_4b8 = plVar14[3];
    local_4d0 = &local_4c0;
  }
  else {
    local_4c0 = *plVar21;
    local_4d0 = (long *)*plVar14;
  }
  local_4c8 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_4d0);
  local_5c8 = &local_5b8;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_5b8 = *plVar21;
    lStack_5b0 = plVar14[3];
  }
  else {
    local_5b8 = *plVar21;
    local_5c8 = (long *)*plVar14;
  }
  local_5c0 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_5c8,local_6a0._0_8_);
  local_618 = &local_608;
  puVar22 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar22) {
    local_608 = *puVar22;
    lStack_600 = plVar14[3];
  }
  else {
    local_608 = *puVar22;
    local_618 = (ulong *)*plVar14;
  }
  local_610 = plVar14[1];
  *plVar14 = (long)puVar22;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_618);
  local_638 = &local_628;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_628 = *plVar21;
    lStack_620 = plVar14[3];
  }
  else {
    local_628 = *plVar21;
    local_638 = (long *)*plVar14;
  }
  pcVar16 = local_670 + 0x10;
  local_630 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_638);
  local_5a8 = &local_598;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_598 = *plVar21;
    lStack_590 = plVar14[3];
  }
  else {
    local_598 = *plVar21;
    local_5a8 = (long *)*plVar14;
  }
  local_5a0 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  local_588 = &local_578;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_578 = *plVar21;
    lStack_570 = plVar14[3];
  }
  else {
    local_578 = *plVar21;
    local_588 = (long *)*plVar14;
  }
  local_580 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_588,local_6a0._0_8_);
  local_568 = &local_558;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_558 = *plVar21;
    lStack_550 = plVar14[3];
  }
  else {
    local_558 = *plVar21;
    local_568 = (long *)*plVar14;
  }
  local_560 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_568);
  local_548 = &local_538;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_538 = *plVar21;
    lStack_530 = plVar14[3];
  }
  else {
    local_538 = *plVar21;
    local_548 = (long *)*plVar14;
  }
  local_540 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_548);
  local_528 = &local_518;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_518 = *plVar21;
    lStack_510 = plVar14[3];
  }
  else {
    local_518 = *plVar21;
    local_528 = (long *)*plVar14;
  }
  local_520 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_528);
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  psVar23 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_6c8.field_2._M_allocated_capacity = *psVar23;
    local_6c8.field_2._8_8_ = plVar14[3];
  }
  else {
    local_6c8.field_2._M_allocated_capacity = *psVar23;
    local_6c8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_6c8._M_string_length = plVar14[1];
  *plVar14 = (long)psVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_6c8);
  psVar23 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar23) {
    local_670._16_8_ = *psVar23;
    local_670._24_8_ = plVar14[3];
    local_670._0_8_ = pcVar16;
  }
  else {
    local_670._16_8_ = *psVar23;
    local_670._0_8_ = (size_type *)*plVar14;
  }
  local_670._8_8_ = plVar14[1];
  *plVar14 = (long)psVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  pTVar13 = (TextureFormat *)std::__cxx11::string::append(local_670);
  local_348._0_8_ = &local_338;
  TVar24 = (TextureFormat)(pTVar13 + 2);
  if (*pTVar13 == TVar24) {
    local_338 = *(TestContext **)TVar24;
    aStack_330._M_allocated_capacity = (size_type)pTVar13[3];
  }
  else {
    local_338 = *(TestContext **)TVar24;
    local_348._0_8_ = *pTVar13;
  }
  local_348._8_8_ = pTVar13[1];
  *pTVar13 = TVar24;
  pTVar13[1].order = R;
  pTVar13[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar13[2].order = R;
  if ((pointer)local_670._0_8_ != pcVar16) {
    operator_delete((void *)local_670._0_8_,local_670._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528,local_518 + 1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,local_538 + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,local_558 + 1);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588,local_578 + 1);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,local_598 + 1);
  }
  if (local_638 != &local_628) {
    operator_delete(local_638,local_628 + 1);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618,local_608 + 1);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8,local_5b8 + 1);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,local_4c0 + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,local_4e8 + 1);
  }
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_670,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_348._0_8_,(char *)TVar24);
  local_5f8 = (undefined1  [8])((ulong)local_5f8 & 0xffffffff00000000);
  auStack_5f0._0_8_ = &aStack_5e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_5f0,local_670._0_8_,(pointer)(local_670._8_8_ + local_670._0_8_));
  if ((pointer)local_670._0_8_ != pcVar16) {
    operator_delete((void *)local_670._0_8_,local_670._16_8_ + 1);
  }
  if ((TestContext **)local_348._0_8_ != &local_338) {
    operator_delete((void *)local_348._0_8_,(ulong)((long)&local_338->m_platform + 1));
  }
  if ((Platform *)local_6a0._0_8_ != &local_690) {
    operator_delete((void *)local_6a0._0_8_,(long)local_690._vptr_Platform + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + ((ulong)local_5f8 & 0xffffffff) * 0x18),(value_type *)auStack_5f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  std::ostream::operator<<(local_348,(int)local_678);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_6c8,0,(char *)0x0,0x9802a7);
  psVar23 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar23) {
    local_670._16_8_ = *psVar23;
    local_670._24_8_ = plVar14[3];
    local_670._0_8_ = pcVar16;
  }
  else {
    local_670._16_8_ = *psVar23;
    local_670._0_8_ = (size_type *)*plVar14;
  }
  local_670._8_8_ = plVar14[1];
  *plVar14 = (long)psVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  local_158._0_8_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>(local_158,pcVar28,local_1c8);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_158,0,(char *)0x0,0x9495b8);
  local_368 = &local_358;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_358 = *plVar21;
    lStack_350 = plVar14[3];
  }
  else {
    local_358 = *plVar21;
    local_368 = (long *)*plVar14;
  }
  local_360 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_368);
  local_3c8 = &local_3b8;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_3b8 = *plVar21;
    lStack_3b0 = plVar14[3];
  }
  else {
    local_3b8 = *plVar21;
    local_3c8 = (long *)*plVar14;
  }
  local_3c0 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar12 = (int)local_670._32_8_ - 0x28;
  DVar11 = TYPE_LAST;
  if (uVar12 < 0x18) {
    DVar11 = *(DataType *)(&DAT_009a3cb4 + (ulong)uVar12 * 4);
  }
  glu::getDataTypeName(DVar11);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_3c8);
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_1b0 = *plVar21;
    lStack_1a8 = plVar14[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *plVar21;
    local_1c0 = (long *)*plVar14;
  }
  local_1b8 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_190 = *plVar21;
    lStack_188 = plVar14[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *plVar21;
    local_1a0 = (long *)*plVar14;
  }
  local_198 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_1a0,local_670._0_8_);
  local_4f8 = &local_4e8;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_4e8 = *plVar21;
    lStack_4e0 = plVar14[3];
  }
  else {
    local_4e8 = *plVar21;
    local_4f8 = (long *)*plVar14;
  }
  local_4f0 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_4f8);
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_4c0 = *plVar21;
    lStack_4b8 = plVar14[3];
    local_4d0 = &local_4c0;
  }
  else {
    local_4c0 = *plVar21;
    local_4d0 = (long *)*plVar14;
  }
  local_4c8 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_4d0);
  local_5c8 = &local_5b8;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_5b8 = *plVar21;
    lStack_5b0 = plVar14[3];
  }
  else {
    local_5b8 = *plVar21;
    local_5c8 = (long *)*plVar14;
  }
  local_5c0 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_5c8);
  local_618 = &local_608;
  puVar22 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar22) {
    local_608 = *puVar22;
    lStack_600 = plVar14[3];
  }
  else {
    local_608 = *puVar22;
    local_618 = (ulong *)*plVar14;
  }
  local_610 = plVar14[1];
  *plVar14 = (long)puVar22;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  pcVar28 = glu::getDataTypeName((DataType)local_670._32_8_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,pcVar28,&local_639);
  uVar27 = 0xf;
  if (local_618 != &local_608) {
    uVar27 = local_608;
  }
  if (uVar27 < (ulong)(local_380 + local_610)) {
    uVar27 = 0xf;
    if (local_388 != local_378) {
      uVar27 = local_378[0];
    }
    if (uVar27 < (ulong)(local_380 + local_610)) goto LAB_005f133c;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_618);
  }
  else {
LAB_005f133c:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_618,(ulong)local_388);
  }
  local_638 = &local_628;
  plVar14 = puVar15 + 2;
  if ((long *)*puVar15 == plVar14) {
    local_628 = *plVar14;
    lStack_620 = puVar15[3];
  }
  else {
    local_628 = *plVar14;
    local_638 = (long *)*puVar15;
  }
  local_630 = puVar15[1];
  *puVar15 = plVar14;
  puVar15[1] = 0;
  *(undefined1 *)plVar14 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_638);
  local_5a8 = &local_598;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_598 = *plVar21;
    lStack_590 = plVar14[3];
  }
  else {
    local_598 = *plVar21;
    local_5a8 = (long *)*plVar14;
  }
  local_5a0 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  local_588 = &local_578;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_578 = *plVar21;
    lStack_570 = plVar14[3];
  }
  else {
    local_578 = *plVar21;
    local_588 = (long *)*plVar14;
  }
  local_580 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_588);
  local_568 = &local_558;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_558 = *plVar21;
    lStack_550 = plVar14[3];
  }
  else {
    local_558 = *plVar21;
    local_568 = (long *)*plVar14;
  }
  local_560 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_568);
  local_548 = &local_538;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_538 = *plVar21;
    lStack_530 = plVar14[3];
  }
  else {
    local_538 = *plVar21;
    local_548 = (long *)*plVar14;
  }
  local_540 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_548);
  local_528 = &local_518;
  plVar21 = plVar14 + 2;
  if ((long *)*plVar14 == plVar21) {
    local_518 = *plVar21;
    lStack_510 = plVar14[3];
  }
  else {
    local_518 = *plVar21;
    local_528 = (long *)*plVar14;
  }
  local_520 = plVar14[1];
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_528,local_180._8_8_);
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  psVar23 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_6c8.field_2._M_allocated_capacity = *psVar23;
    local_6c8.field_2._8_8_ = plVar14[3];
  }
  else {
    local_6c8.field_2._M_allocated_capacity = *psVar23;
    local_6c8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_6c8._M_string_length = plVar14[1];
  *plVar14 = (long)psVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  pTVar13 = (TextureFormat *)std::__cxx11::string::append((char *)&local_6c8);
  local_348._0_8_ = &local_338;
  TVar24 = (TextureFormat)(pTVar13 + 2);
  if (*pTVar13 == TVar24) {
    local_338 = *(TestContext **)TVar24;
    aStack_330._M_allocated_capacity = (size_type)pTVar13[3];
  }
  else {
    local_338 = *(TestContext **)TVar24;
    local_348._0_8_ = *pTVar13;
  }
  local_348._8_8_ = pTVar13[1];
  *pTVar13 = TVar24;
  pTVar13[1].order = R;
  pTVar13[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar13[2].order = R;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528,local_518 + 1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,local_538 + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,local_558 + 1);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588,local_578 + 1);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,local_598 + 1);
  }
  if (local_638 != &local_628) {
    operator_delete(local_638,local_628 + 1);
  }
  if (local_388 != local_378) {
    operator_delete(local_388,local_378[0] + 1);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618,local_608 + 1);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8,local_5b8 + 1);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,local_4c0 + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,local_4e8 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,local_3b8 + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,local_358 + 1);
  }
  if ((qpWatchDog **)local_158._0_8_ != local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)&local_148[0]->timeOutFunc + 1));
  }
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_6c8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_348._0_8_,(char *)TVar24);
  local_6a0._0_4_ = 1;
  local_6a0._8_8_ = &aStack_688;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_6a0 + 8),local_6c8._M_dataplus._M_p,
             local_6c8._M_dataplus._M_p + local_6c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((TestContext **)local_348._0_8_ != &local_338) {
    operator_delete((void *)local_348._0_8_,(ulong)((long)&local_338->m_platform + 1));
  }
  if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
    operator_delete((void *)local_670._0_8_,local_670._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + (local_6a0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_6a0 + 8));
  lVar30 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_128 + lVar30),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_498 + lVar30));
    lVar30 = lVar30 + 0x18;
  } while (lVar30 != 0x90);
  local_678 = &vStack_98;
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (local_678,&vStack_408);
  local_80 = local_3f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3e8);
  local_60 = (bool)local_3d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._8_8_ != &aStack_688) {
    operator_delete((void *)local_6a0._8_8_,aStack_688._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_5f0._0_8_ != &aStack_5e0) {
    operator_delete((void *)auStack_5f0._0_8_,aStack_5e0._0_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_408);
  lVar30 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + lVar30));
    lVar30 = lVar30 + -0x18;
  } while (lVar30 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._8_8_ != &local_168) {
    operator_delete((void *)local_180._8_8_,local_168._M_allocated_capacity + 1);
  }
  pSVar8 = local_4a8;
  glu::ShaderProgram::ShaderProgram(local_4a8,local_500,(ProgramSources *)local_128);
  local_138.m_data.ptr = (ShaderProgram *)0x0;
  pMVar1 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      pSVar8) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&pMVar1->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (pMVar1->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = pSVar8;
  }
  local_648 = pMVar1;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (local_678);
  lVar30 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_128 + lVar30));
    lVar30 = lVar30 + -0x18;
  } while (lVar30 != -0x18);
  if (this->m_currentIteration == 0) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    (this->m_program).
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                    m_data.ptr);
    cVar32 = (char)((uint)iVar29 >> 0x10);
  }
  else {
    local_348._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_348 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               "Using a program similar to the previous one, except with a gather function call as follows:\n"
               ,0x5c);
    GVar6 = this->m_gatherType;
    getOffsetRange((TextureGatherCase *)local_128);
    genGatherFuncCall((string *)local_498,(TextureGatherCase *)(ulong)GVar6,(GatherType)local_508,
                      local_54,(GatherArgs *)local_3a8,(string *)local_128,
                      (IVec2 *)((ulong)in_stack_fffffffffffff92c << 0x20),iVar29);
    cVar32 = (char)((uint)iVar29 >> 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_498,(long)TStack_490);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_498 != (undefined1  [8])local_488) {
      operator_delete((void *)local_498,local_488._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_2d0);
  }
  lVar30 = local_4d8;
  pSVar8 = (local_648->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
           ).m_data.ptr;
  if ((pSVar8->m_program).m_info.linkOk == false) {
    if (this->m_currentIteration != 0) {
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar8
                     );
    }
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar17,"Failed to build program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
               ,0x561);
    __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(local_4d8 + 0x1a00))(0,0,0x40,0x40);
  (**(code **)(lVar30 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar30 + 0x188))(0x4000);
  local_128._16_8_ = (pointer)0xbf8000003f800000;
  local_128._24_8_ = (pointer)0x3f8000003f800000;
  local_128._0_4_ = 0xbf800000;
  local_128._4_4_ = 0xbf800000;
  local_128._8_8_ = (TestContext *)0x3f800000bf800000;
  auStack_5f0._8_8_ = 0x3f800000;
  aStack_5e0._0_8_ = 0x3f8000003f800000;
  local_5f8._0_4_ = R;
  local_5f8._4_4_ = SNORM_INT8;
  auStack_5f0._0_8_ = (pointer)0x3f80000000000000;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
            (local_670,this,(ulong)(uint)this->m_currentIteration);
  local_6c8._M_dataplus._M_p = (pointer)0x0;
  local_6c8._M_string_length = 0;
  local_6c8.field_2._M_allocated_capacity = 0;
  local_6a0._0_8_ = &local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"a_position","");
  local_498._0_4_ = A;
  TVar24 = (TextureFormat)((long)local_488 + 8);
  TStack_490 = TVar24;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&TStack_490,local_6a0._0_8_,(char *)(local_6a0._8_8_ + local_6a0._0_8_));
  uStack_470 = (ulong)uStack_470._4_4_ << 0x20;
  local_348._0_4_ = local_498._0_4_;
  local_348._8_8_ = &aStack_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_348 + 8),TStack_490,(undefined1 *)(local_488._0_8_ + (long)TStack_490)
            );
  local_320 = (int)uStack_470;
  local_318[0].componentType = VTX_COMP_FLOAT;
  local_318[0].convert = VTX_COMP_CONVERT_NONE;
  local_318[0].numComponents = 2;
  local_318[0].numElements = 4;
  local_318[0].stride = 0;
  local_318[0].data = local_128;
  if (TStack_490 != TVar24) {
    operator_delete((void *)TStack_490,local_488._8_8_ + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)&local_6c8
             ,(VertexArrayBinding *)local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._8_8_ != &aStack_330) {
    operator_delete((void *)local_348._8_8_,(ulong)(aStack_330._M_allocated_capacity + 1));
  }
  if ((Platform *)local_6a0._0_8_ != &local_690) {
    operator_delete((void *)local_6a0._0_8_,(long)local_690._vptr_Platform + 1);
  }
  local_6a0._0_8_ = &local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"a_texCoord","");
  uVar9 = local_670._0_8_;
  iVar10 = (int)((ulong)(local_670._8_8_ - local_670._0_8_) >> 2);
  iVar29 = iVar10 + 3;
  if (-1 < iVar10) {
    iVar29 = iVar10;
  }
  local_498._0_4_ = A;
  TStack_490 = TVar24;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&TStack_490,local_6a0._0_8_,(char *)(local_6a0._8_8_ + local_6a0._0_8_));
  uStack_470 = uStack_470 & 0xffffffff00000000;
  local_348._0_4_ = local_498._0_4_;
  local_348._8_8_ = &aStack_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_348 + 8),TStack_490,(undefined1 *)(local_488._0_8_ + (long)TStack_490)
            );
  local_318[0].numComponents = iVar29 >> 2;
  local_320 = (int)uStack_470;
  local_318[0].componentType = VTX_COMP_FLOAT;
  local_318[0].convert = VTX_COMP_CONVERT_NONE;
  local_318[0].numElements = 4;
  local_318[0].stride = 0;
  local_318[0].data = (void *)uVar9;
  if (TStack_490 != TVar24) {
    operator_delete((void *)TStack_490,local_488._8_8_ + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)&local_6c8
             ,(VertexArrayBinding *)local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._8_8_ != &aStack_330) {
    operator_delete((void *)local_348._8_8_,(ulong)(aStack_330._M_allocated_capacity + 1));
  }
  if ((Platform *)local_6a0._0_8_ != &local_690) {
    operator_delete((void *)local_6a0._0_8_,(long)local_690._vptr_Platform + 1);
  }
  if (cVar32 != '\0') {
    local_6a0._0_8_ = &local_690;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"a_normalizedCoord","");
    local_498._0_4_ = A;
    TStack_490 = TVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&TStack_490,local_6a0._0_8_,(char *)(local_6a0._8_8_ + local_6a0._0_8_));
    uStack_470 = uStack_470 & 0xffffffff00000000;
    local_348._0_4_ = local_498._0_4_;
    local_348._8_8_ = &aStack_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),TStack_490,
               (undefined1 *)(local_488._0_8_ + (long)TStack_490));
    local_320 = (int)uStack_470;
    local_318[0].componentType = VTX_COMP_FLOAT;
    local_318[0].convert = VTX_COMP_CONVERT_NONE;
    local_318[0].numComponents = 2;
    local_318[0].numElements = 4;
    local_318[0].stride = 0;
    local_318[0].data = local_5f8;
    if (TStack_490 != TVar24) {
      operator_delete((void *)TStack_490,local_488._8_8_ + 1);
    }
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
               &local_6c8,(VertexArrayBinding *)local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._8_8_ != &aStack_330) {
      operator_delete((void *)local_348._8_8_,(ulong)(aStack_330._M_allocated_capacity + 1));
    }
    if ((Platform *)local_6a0._0_8_ != &local_690) {
      operator_delete((void *)local_6a0._0_8_,(long)local_690._vptr_Platform + 1);
    }
  }
  lVar30 = local_4d8;
  pMVar1 = local_648;
  local_6a0._0_8_ = (Platform *)0x2000200010000;
  local_6a0._8_4_ = 0x30001;
  (**(code **)(local_4d8 + 0x1680))
            ((((local_648->
               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data
              .ptr)->m_program).m_program);
  iVar10 = (**(code **)(lVar30 + 0xb48))
                     ((((pMVar1->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                        ).m_data.ptr)->m_program).m_program);
  if (iVar10 < 0) {
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar17,(char *)0x0,"samplerUniformLocation >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
               ,0x589);
    __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar30 + 0x14f0))(iVar10,0);
  if (GVar3 == GATHERTYPE_OFFSET_DYNAMIC) {
    iVar10 = (**(code **)(lVar30 + 0xb48))
                       ((((pMVar1->
                          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                          ).m_data.ptr)->m_program).m_program);
    if (iVar10 < 0) {
      pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar17,(char *)0x0,"viewportSizeUniformLocation >= 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                 ,0x590);
      __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar30 + 0x1520))(0x42800000,0x42800000,iVar10);
  }
  lVar30 = (long)(local_670._8_8_ - local_670._0_8_) >> 2;
  if (lVar30 == 0xc) {
    local_478 = (undefined1  [8])0x0;
    uStack_470 = 0;
    local_488._0_8_ = 0;
    local_488._8_8_ = 0;
    local_498._0_4_ = R;
    local_498._4_4_ = SNORM_INT8;
    TStack_490.order = R;
    TStack_490.type = SNORM_INT8;
    lVar30 = 0;
    pcVar16 = (pointer)local_670._0_8_;
    do {
      lVar25 = 0;
      do {
        *(undefined4 *)(__s + lVar25 * 4) = *(undefined4 *)(pcVar16 + lVar25 * 4);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 3);
      lVar30 = lVar30 + 1;
      __s = __s + 0xc;
      pcVar16 = pcVar16 + 0xc;
    } while (lVar30 != 4);
    poVar2 = (ostringstream *)(local_348 + 8);
    local_348._0_4_ = local_4b0.order;
    local_348._4_4_ = local_4b0.type;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Texture coordinates run from ",0x1d);
    tcu::operator<<((ostream *)poVar2,(Vector<float,_3> *)local_498);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," to ",4);
    tcu::operator<<((ostream *)poVar2,(Vector<float,_3> *)(local_478 + 4));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (lVar30 != 8) goto LAB_005f22d6;
    local_488._0_8_ = 0;
    local_488._8_8_ = 0;
    local_498._0_4_ = R;
    local_498._4_4_ = SNORM_INT8;
    TStack_490.order = R;
    TStack_490.type = SNORM_INT8;
    lVar30 = 0;
    do {
      *(undefined4 *)(local_498 + lVar30 * 8) = *(undefined4 *)(local_670._0_8_ + lVar30 * 8);
      *(undefined4 *)(local_498 + lVar30 * 8 + 4) =
           *(undefined4 *)(local_670._0_8_ + lVar30 * 8 + 4);
      lVar30 = lVar30 + 1;
    } while (lVar30 != 4);
    poVar2 = (ostringstream *)(local_348 + 8);
    local_348._0_4_ = local_4b0.order;
    local_348._4_4_ = local_4b0.type;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Texture coordinates run from ",0x1d);
    tcu::operator<<((ostream *)poVar2,(Vector<float,_2> *)local_498);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," to ",4);
    tcu::operator<<((ostream *)poVar2,(Vector<float,_2> *)(local_488 + 8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_348 + 8));
  std::ios_base::~ios_base(local_2d0);
LAB_005f22d6:
  local_348._0_4_ = R;
  local_348._4_4_ = UNORM_INT32;
  local_348._8_4_ = 1;
  local_338 = (TestContext *)local_6a0;
  glu::draw(local_500,
            (((pMVar1->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
              ).m_data.ptr)->m_program).m_program,
            (int)(local_6c8._M_string_length - (long)local_6c8._M_dataplus._M_p >> 4) * -0x33333333,
            (VertexArrayBinding *)local_6c8._M_dataplus._M_p,(PrimitiveList *)local_348,
            (DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)&local_6c8
            );
  if ((pointer)local_670._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_670._0_8_,local_670._16_8_ - local_670._0_8_);
  }
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_5f8,&this->m_colorBufferFormat,0x40,0x40,1);
  if ((this->m_colorBufferFormat).order == RGBA) {
    CVar7 = (this->m_colorBufferFormat).type;
    if (((ulong)CVar7 < 0x22) && ((0x220000008U >> ((ulong)CVar7 & 0x3f) & 1) != 0)) {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_348,(TextureLevel *)local_5f8);
      glu::readPixels(local_500,0,0,(PixelBufferAccess *)local_348);
    }
    else {
      CVar18 = SIGNED_INT32;
      if ((CVar7 - SIGNED_INT8 < 3) ||
         ((CVar7 < HALF_FLOAT &&
          (CVar18 = UNSIGNED_INT32, (0x2c0000000U >> ((ulong)CVar7 & 0x3f) & 1) != 0)))) {
        local_498._4_4_ = CVar18;
        local_498._0_4_ = RGBA;
        tcu::TextureLevel::TextureLevel
                  ((TextureLevel *)local_348,(TextureFormat *)local_498,0x40,0x40,1);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_498,(TextureLevel *)local_348);
        glu::readPixels(local_500,0,0,(PixelBufferAccess *)local_498);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_498,(TextureLevel *)local_5f8);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_128,(TextureLevel *)local_348);
        tcu::copy((EVP_PKEY_CTX *)local_498,(EVP_PKEY_CTX *)local_128);
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_348);
      }
    }
  }
  uVar12 = this->m_currentIteration;
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_348,(TextureLevel *)local_5f8);
  iVar10 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                     (this,(ulong)uVar12,local_348);
  if ((char)iVar10 == '\0') {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Result verification failed");
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_5f8);
    IVar26 = STOP;
  }
  else {
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_5f8);
    iVar29 = this->m_currentIteration + 1;
    this->m_currentIteration = iVar29;
    iVar10 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
    IVar26 = CONTINUE;
    if (iVar29 == iVar10) {
      IVar26 = STOP;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
  }
  tcu::TestLog::endSection(local_4a0.m_log);
  return IVar26;
}

Assistant:

TextureGatherCase::IterateResult TextureGatherCase::iterate (void)
{
	TestLog&						log								= m_testCtx.getLog();
	const tcu::ScopedLogSection		iterationSection				(log, "Iteration" + de::toString(m_currentIteration), "Iteration " + de::toString(m_currentIteration));
	const glu::RenderContext&		renderCtx						= m_context.getRenderContext();
	const glw::Functions&			gl								= renderCtx.getFunctions();
	const GatherArgs&				gatherArgs						= getGatherArgs(m_currentIteration);
	const string					refZExpr						= "v_normalizedCoord.x";
	const bool						needPixelCoordInShader			= m_gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool						needNormalizedCoordInShader		= needPixelCoordInShader || isDepthFormat(m_textureFormat);

	// Generate a program appropriate for this iteration.

	m_program = MovePtr<ShaderProgram>(new ShaderProgram(renderCtx, genProgramSources(m_gatherType, m_textureType, m_textureFormat, gatherArgs, refZExpr, getOffsetRange())));
	if (m_currentIteration == 0)
		m_testCtx.getLog() << *m_program;
	else
		m_testCtx.getLog() << TestLog::Message << "Using a program similar to the previous one, except with a gather function call as follows:\n"
											   << genGatherFuncCall(m_gatherType, m_textureFormat, gatherArgs, refZExpr, getOffsetRange(), 0)
											   << TestLog::EndMessage;
	if (!m_program->isOk())
	{
		if (m_currentIteration != 0)
			m_testCtx.getLog() << *m_program;
		TCU_FAIL("Failed to build program");
	}

	// Render.

	gl.viewport(0, 0, RENDER_SIZE.x(), RENDER_SIZE.y());
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	{
		const float position[4*2] =
		{
			-1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
		};

		const float normalizedCoord[4*2] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f,
		};

		const vector<float> texCoord = computeQuadTexCoord(m_currentIteration);

		vector<glu::VertexArrayBinding> attrBindings;
		attrBindings.push_back(glu::va::Float("a_position", 2, 4, 0, &position[0]));
		attrBindings.push_back(glu::va::Float("a_texCoord", (int)texCoord.size()/4, 4, 0, &texCoord[0]));
		if (needNormalizedCoordInShader)
			attrBindings.push_back(glu::va::Float("a_normalizedCoord", 2, 4, 0, &normalizedCoord[0]));

		const deUint16 indices[6] = { 0, 1, 2, 2, 1, 3 };

		gl.useProgram(m_program->getProgram());

		{
			const int samplerUniformLocation = gl.getUniformLocation(m_program->getProgram(), "u_sampler");
			TCU_CHECK(samplerUniformLocation >= 0);
			gl.uniform1i(samplerUniformLocation, 0);
		}

		if (needPixelCoordInShader)
		{
			const int viewportSizeUniformLocation = gl.getUniformLocation(m_program->getProgram(), "u_viewportSize");
			TCU_CHECK(viewportSizeUniformLocation >= 0);
			gl.uniform2f(viewportSizeUniformLocation, (float)RENDER_SIZE.x(), (float)RENDER_SIZE.y());
		}

		if (texCoord.size() == 2*4)
		{
			Vec2 texCoordVec[4];
			computeTexCoordVecs(texCoord, texCoordVec);
			log << TestLog::Message << "Texture coordinates run from " << texCoordVec[0] << " to " << texCoordVec[3] << TestLog::EndMessage;
		}
		else if (texCoord.size() == 3*4)
		{
			Vec3 texCoordVec[4];
			computeTexCoordVecs(texCoord, texCoordVec);
			log << TestLog::Message << "Texture coordinates run from " << texCoordVec[0] << " to " << texCoordVec[3] << TestLog::EndMessage;
		}
		else
			DE_ASSERT(false);

		glu::draw(renderCtx, m_program->getProgram(), (int)attrBindings.size(), &attrBindings[0],
			glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
	}

	// Verify result.

	{
		const tcu::TextureLevel rendered = getPixels(renderCtx, RENDER_SIZE, m_colorBufferFormat);

		if (!verify(m_currentIteration, rendered.getAccess()))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result verification failed");
			return STOP;
		}
	}

	m_currentIteration++;
	if (m_currentIteration == (int)getNumIterations())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	else
		return CONTINUE;
}